

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

bool P_LoadGLNodes(MapData *map)

{
  uint uVar1;
  uint uVar2;
  FileReader *pFVar3;
  bool bVar4;
  int iVar5;
  int wadnum;
  int iVar6;
  int iVar7;
  FILE *__stream;
  size_t sVar8;
  void *__ptr;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char *label;
  FWadLump *pFVar13;
  FResourceFile *pFVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar16;
  ulong uVar17;
  uint *puVar18;
  uint i_1;
  char (*__s2) [9];
  DWORD i;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  char magic [4];
  FString path;
  BYTE md5map [16];
  uint local_16c;
  BYTE md5 [16];
  int id;
  
  pFVar3 = map->MapLumps[6].Reader;
  if ((pFVar3 != (FileReader *)0x0) && (pFVar3->Length != 0)) {
    map->file = pFVar3;
    (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,&id,4);
    if (((id == 0x324c4758) || (((id == 0x324c475a || (id == 0x334c4758)) || (id == 0x334c475a))))
       || ((id == 0x4e4c475a || (id == 0x4e4c4758)))) {
      subsectors = (subsector_t *)0x0;
      segs = (seg_t *)0x0;
      nodes = (node_t *)0x0;
      P_LoadZNodes(map->file,id);
      return true;
    }
  }
  magic[0] = '\0';
  magic[1] = '\0';
  magic[2] = '\0';
  magic[3] = '\0';
  CreateCacheName((MapData *)&path,SUB81(map,0));
  __stream = fopen(path.Chars,"rb");
  if (__stream != (FILE *)0x0) {
    sVar8 = fread(magic,1,4,__stream);
    if (((sVar8 == 4) && (magic == (char  [4])0x48434143)) &&
       ((sVar8 = fread(&local_16c,4,1,__stream), sVar8 == 1 &&
        ((local_16c == numlines && (sVar8 = fread(md5,1,0x10,__stream), sVar8 == 0x10)))))) {
      MapData::GetChecksum(map,md5map);
      auVar21[0] = -(md5[0] == md5map[0]);
      auVar21[1] = -(md5[1] == md5map[1]);
      auVar21[2] = -(md5[2] == md5map[2]);
      auVar21[3] = -(md5[3] == md5map[3]);
      auVar21[4] = -(md5[4] == md5map[4]);
      auVar21[5] = -(md5[5] == md5map[5]);
      auVar21[6] = -(md5[6] == md5map[6]);
      auVar21[7] = -(md5[7] == md5map[7]);
      auVar21[8] = -(md5[8] == md5map[8]);
      auVar21[9] = -(md5[9] == md5map[9]);
      auVar21[10] = -(md5[10] == md5map[10]);
      auVar21[0xb] = -(md5[0xb] == md5map[0xb]);
      auVar21[0xc] = -(md5[0xc] == md5map[0xc]);
      auVar21[0xd] = -(md5[0xd] == md5map[0xd]);
      auVar21[0xe] = -(md5[0xe] == md5map[0xe]);
      auVar21[0xf] = -(md5[0xf] == md5map[0xf]);
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
        __ptr = operator_new__((ulong)(local_16c * 8) << 2);
        sVar8 = fread(__ptr,8,(ulong)local_16c,__stream);
        if (((sVar8 == local_16c) && (sVar8 = fread(magic,1,4,__stream), sVar8 == 4)) &&
           (((uint)magic & 0xfeffffff) == 0x324c475a)) {
          lVar9 = ftell(__stream);
          FileReader::FileReader((FileReader *)&id,(FILE *)__stream);
          FileReader::Seek((FileReader *)&id,lVar9,0);
          P_LoadZNodes((FileReader *)&id,
                       (uint)magic & 0xff000000 | (int)magic[2] << 0x10 |
                       (int)magic[1] << 8 | (int)magic[0]);
          MemoryReader::~MemoryReader((MemoryReader *)&id);
          uVar10 = 0;
          uVar17 = (ulong)(uint)numlines;
          if (numlines < 1) {
            uVar17 = uVar10;
          }
          puVar18 = (uint *)((long)__ptr + 4);
          for (; uVar17 * 0x13 - uVar10 != 0; uVar10 = uVar10 + 0x13) {
            *(vertex_t **)(lines->args + uVar10 * 2 + -0xb) = vertexes + puVar18[-1];
            *(vertex_t **)(lines->args + uVar10 * 2 + -9) = vertexes + *puVar18;
            puVar18 = puVar18 + 2;
          }
          operator_delete__(__ptr);
          fclose(__stream);
          FString::~FString(&path);
          return true;
        }
        operator_delete__(__ptr);
      }
    }
    fclose(__stream);
  }
  FString::~FString(&path);
  md5[0] = '\0';
  md5[1] = '\0';
  md5[2] = '\0';
  md5[3] = '\0';
  md5[4] = '\0';
  md5[5] = '\0';
  md5[6] = '\0';
  md5[7] = '\0';
  md5[8] = '\0';
  md5[9] = '\0';
  md5[10] = '\0';
  md5[0xb] = '\0';
  md5[0xc] = '\0';
  md5[0xd] = '\0';
  md5[0xe] = '\0';
  md5[0xf] = '\0';
  iVar5 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
  bVar4 = map->InWad;
  pFVar14 = map->resource;
  pcVar11 = FWadCollection::GetWadFullName(&Wads,iVar5);
  if (bVar4 == true) {
    iVar5 = map->lumpnum;
    wadnum = FWadCollection::GetLumpFile(&Wads,iVar5);
    _id = (char *)0x71deec;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    pcVar12 = FWadCollection::GetLumpFullName(&Wads,iVar5);
    FString::Format((FString *)&id,"GL_%s",pcVar12);
    if (*(uint *)(_id + -0xc) < 9) {
      iVar6 = FWadCollection::CheckNumForName(&Wads,_id,0,wadnum,true);
      if (iVar6 < 0) {
LAB_00404ae9:
        iVar6 = -1;
      }
    }
    else {
      iVar6 = FWadCollection::CheckNumForName(&Wads,"GL_LEVEL",0,wadnum,true);
      if (iVar6 < 0) goto LAB_00404ae9;
      path.Chars = path.Chars & 0xffffffff00000000;
      do {
        do {
          iVar6 = FWadCollection::FindLump(&Wads,"GL_LEVEL",(int *)&path,false);
          if (iVar6 < 0) goto LAB_00404ae9;
          iVar7 = FWadCollection::GetLumpFile(&Wads,iVar6);
        } while (iVar7 != wadnum);
        FWadCollection::ReadLump((FWadCollection *)md5map,0x1c6a4b0);
        label = FWadCollection::GetLumpFullName(&Wads,iVar5);
        pcVar12 = (char *)0x0;
        if (*(int *)(md5map._0_8_ + -0xc) != 0) {
          pcVar12 = (char *)md5map._0_8_;
        }
        bVar4 = MatchHeader(label,pcVar12);
        FMemLump::~FMemLump((FMemLump *)md5map);
      } while (!bVar4);
    }
    FString::~FString((FString *)&id);
    if (-1 < iVar6) {
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        pFVar13 = FWadCollection::ReopenLumpNum(&Wads,(int)lVar9 + iVar6 + 1);
        *(FWadLump **)(md5 + lVar9 * 8) = pFVar13;
      }
      bVar4 = DoLoadGLNodes((FileReader **)md5);
      return bVar4;
    }
    strcpy((char *)&id,pcVar11);
    pcVar11 = strrchr((char *)&id,0x2e);
    if (pcVar11 == (char *)0x0) goto LAB_00404bbb;
    builtin_strncpy(pcVar11,".gwa",5);
    pFVar14 = FResourceFile::OpenResourceFile((char *)&id,(FileReader *)0x0,true,false);
    if (pFVar14 == (FResourceFile *)0x0) {
      return false;
    }
    pcVar11 = FWadCollection::GetLumpFullName(&Wads,map->lumpnum);
    strncpy((char *)map,pcVar11,8);
  }
  else {
LAB_00404bbb:
    if (pFVar14 == (FResourceFile *)0x0) {
      bVar4 = false;
      goto LAB_00404d53;
    }
  }
  path.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  uVar1 = pFVar14->NumLumps;
  FString::Format(&path,"GL_%.8s",map);
  uVar2 = *(uint *)(path.Chars + -0xc);
  if (8 < uVar2) {
    FString::operator=(&path,"GL_LEVEL");
  }
  uVar20 = 0xffffffff;
  if (4 < uVar1) {
    for (uVar19 = 0; uVar20 = 0xffffffff, uVar1 - 4 != uVar19; uVar19 = uVar19 + 1) {
      iVar5 = (*pFVar14->_vptr_FResourceFile[4])(pFVar14,(ulong)uVar19);
      iVar5 = strncasecmp((char *)(CONCAT44(extraout_var,iVar5) + 0x18),path.Chars,8);
      if (iVar5 == 0) {
        uVar20 = uVar19;
        if (uVar2 < 9) break;
        md5map[0] = '\0';
        md5map[1] = '\0';
        md5map[2] = '\0';
        md5map[3] = '\0';
        md5map[4] = '\0';
        md5map[5] = '\0';
        md5map[6] = '\0';
        md5map[7] = '\0';
        md5map[8] = '\0';
        md5map[9] = '\0';
        md5map[10] = '\0';
        md5map[0xb] = '\0';
        md5map[0xc] = '\0';
        md5map[0xd] = '\0';
        md5map[0xe] = '\0';
        md5map[0xf] = '\0';
        iVar5 = (*pFVar14->_vptr_FResourceFile[4])(pFVar14,(ulong)uVar19);
        plVar15 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x10))
                                    ((long *)CONCAT44(extraout_var_00,iVar5));
        (**(code **)(*plVar15 + 0x10))(plVar15,md5map,0x10);
        bVar4 = MatchHeader((char *)map,(char *)md5map);
        if (bVar4) break;
      }
    }
  }
  FString::~FString(&path);
  if (uVar20 == 0xffffffff) {
    bVar4 = false;
  }
  else {
    __s2 = P_LoadGLNodes::check;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      uVar17 = (ulong)(uVar20 + 1) + lVar9;
      iVar5 = (*pFVar14->_vptr_FResourceFile[4])(pFVar14,uVar17 & 0xffffffff);
      iVar5 = strncasecmp((char *)(CONCAT44(extraout_var_01,iVar5) + 0x18),*__s2,8);
      if (iVar5 != 0) {
        bVar4 = false;
        goto LAB_00404d40;
      }
      iVar5 = (*pFVar14->_vptr_FResourceFile[4])(pFVar14,uVar17 & 0xffffffff);
      uVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x18))
                         ((long *)CONCAT44(extraout_var_02,iVar5));
      *(undefined8 *)(md5 + lVar9 * 8) = uVar16;
      __s2 = __s2 + 1;
    }
    bVar4 = DoLoadGLNodes((FileReader **)md5);
  }
LAB_00404d40:
  if (pFVar14 != map->resource) {
    (*pFVar14->_vptr_FResourceFile[1])(pFVar14);
  }
LAB_00404d53:
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    if (*(long **)(md5 + lVar9 * 8) != (long *)0x0) {
      (**(code **)(**(long **)(md5 + lVar9 * 8) + 8))();
    }
  }
  return bVar4;
}

Assistant:

bool P_LoadGLNodes(MapData * map)
{
	if (map->MapLumps[ML_GLZNODES].Reader && map->MapLumps[ML_GLZNODES].Reader->GetLength() != 0)
	{
		const int idcheck1a = MAKE_ID('Z','G','L','N');
		const int idcheck2a = MAKE_ID('Z','G','L','2');
		const int idcheck3a = MAKE_ID('Z','G','L','3');
		const int idcheck1b = MAKE_ID('X','G','L','N');
		const int idcheck2b = MAKE_ID('X','G','L','2');
		const int idcheck3b = MAKE_ID('X','G','L','3');
		int id;

		map->Seek(ML_GLZNODES);
		map->file->Read (&id, 4);
		if (id == idcheck1a || id == idcheck2a || id == idcheck3a ||
			id == idcheck1b || id == idcheck2b || id == idcheck3b)
		{
			try
			{
				subsectors = NULL;
				segs = NULL;
				nodes = NULL;
				P_LoadZNodes (*map->file, id);
				return true;
			}
			catch (CRecoverableError &)
			{
				if (subsectors != NULL)
				{
					delete[] subsectors;
					subsectors = NULL;
				}
				if (segs != NULL)
				{
					delete[] segs;
					segs = NULL;
				}
				if (nodes != NULL)
				{
					delete[] nodes;
					nodes = NULL;
				}
			}
		}
	}

	if (!CheckCachedNodes(map))
	{
		FileReader *gwalumps[4] = { NULL, NULL, NULL, NULL };
		char path[256];
		int li;
		int lumpfile = Wads.GetLumpFile(map->lumpnum);
		bool mapinwad = map->InWad;
		FResourceFile * f_gwa = map->resource;

		const char * name = Wads.GetWadFullName(lumpfile);

		if (mapinwad)
		{
			li = FindGLNodesInWAD(map->lumpnum);

			if (li>=0)
			{
				// GL nodes are loaded with a WAD
				for(int i=0;i<4;i++)
				{
					gwalumps[i]=Wads.ReopenLumpNum(li+i+1);
				}
				return DoLoadGLNodes(gwalumps);
			}
			else
			{
				strcpy(path, name);

				char * ext = strrchr(path, '.');
				if (ext)
				{
					strcpy(ext, ".gwa");
					// Todo: Compare file dates

					f_gwa = FResourceFile::OpenResourceFile(path, NULL, true);
					if (f_gwa==NULL) return false;

					strncpy(map->MapLumps[0].Name, Wads.GetLumpFullName(map->lumpnum), 8);
				}
			}
		}

		bool result = false;
		li = FindGLNodesInFile(f_gwa, map->MapLumps[0].Name);
		if (li!=-1)
		{
			static const char check[][9]={"GL_VERT","GL_SEGS","GL_SSECT","GL_NODES"};
			result=true;
			for(unsigned i=0; i<4;i++)
			{
				if (strnicmp(f_gwa->GetLump(li+i+1)->Name, check[i], 8))
				{
					result=false;
					break;
				}
				else
					gwalumps[i] = f_gwa->GetLump(li+i+1)->NewReader();
			}
			if (result) result = DoLoadGLNodes(gwalumps);
		}

		if (f_gwa != map->resource)
			delete f_gwa;
		for(unsigned int i = 0;i < 4;++i)
			delete gwalumps[i];
		return result;
	}
	else return true;
}